

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::find_layer_index_by_name(Net *this,char *name)

{
  int iVar1;
  pointer ppLVar2;
  ulong uVar3;
  
  ppLVar2 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar2) {
    uVar3 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)&ppLVar2[uVar3]->name);
      if (iVar1 == 0) goto LAB_0012dbc9;
      uVar3 = uVar3 + 1;
      ppLVar2 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3))
    ;
  }
  find_layer_index_by_name();
  uVar3 = 0xffffffff;
LAB_0012dbc9:
  return (int)uVar3;
}

Assistant:

int Net::find_layer_index_by_name(const char* name) const
{
    for (size_t i=0; i<layers.size(); i++)
    {
        const Layer* layer = layers[i];
        if (layer->name == name)
        {
            return static_cast<int>(i);
        }
    }

    NCNN_LOGE("find_layer_index_by_name %s failed", name);
    return -1;
}